

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O3

void __thiscall
re2::SparseArray<re2::NFA::Thread_*>::~SparseArray(SparseArray<re2::NFA::Thread_*> *this)

{
  int iVar1;
  int *piVar2;
  pointer pIVar3;
  
  iVar1 = this->size_;
  if (iVar1 < 0) {
    __assert_fail("(0) <= (size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c4,
                  "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                 );
  }
  if (this->max_size_ < iVar1) {
    __assert_fail("(size_) <= (max_size_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c5,
                  "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                 );
  }
  piVar2 = this->sparse_to_dense_;
  if (piVar2 == (int *)0x0 && iVar1 != 0) {
    __assert_fail("size_ == 0 || sparse_to_dense_ != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1c6,
                  "void re2::SparseArray<re2::NFA::Thread *>::DebugCheckInvariants() const [Value = re2::NFA::Thread *]"
                 );
  }
  if (piVar2 != (int *)0x0) {
    operator_delete__(piVar2);
  }
  pIVar3 = (this->dense_).
           super__Vector_base<re2::SparseArray<re2::NFA::Thread_*>::IndexValue,_std::allocator<re2::SparseArray<re2::NFA::Thread_*>::IndexValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar3 != (pointer)0x0) {
    operator_delete(pIVar3);
    return;
  }
  return;
}

Assistant:

void SparseArray<Value>::DebugCheckInvariants() const {
  DCHECK_LE(0, size_);
  DCHECK_LE(size_, max_size_);
  DCHECK(size_ == 0 || sparse_to_dense_ != NULL);
}